

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O3

void __thiscall
directed_flag_complex_computer::directed_flag_complex_computer_t::directed_flag_complex_computer_t
          (directed_flag_complex_computer_t *this,filtered_directed_graph_t *_graph,
          flagser_parameters *params)

{
  pointer pcVar1;
  unsigned_short uVar2;
  int iVar3;
  unsigned_long *puVar4;
  iterator iVar5;
  allocator_type local_49;
  value_type_conflict3 local_48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  this->graph = _graph;
  this->filtration_algorithm =
       (params->filtration_algorithm)._M_t.
       super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>.
       _M_t.
       super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
       .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl;
  uVar2 = params->min_dimension;
  this->max_dimension = params->max_dimension;
  this->min_dimension = uVar2;
  this->current_dimension = 0;
  this->_is_top_dimension = false;
  local_40 = &this->cell_count;
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = &(this->cache).field_2;
  (this->cache)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (params->cache)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->cache,pcVar1,pcVar1 + (params->cache)._M_string_length);
  this->nb_threads = params->nb_threads;
  (this->flag_complex).graph = this->graph;
  (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<compressed_sparse_matrix<int>,_std::allocator<compressed_sparse_matrix<int>_>_>::
  vector(&this->coboundary_matrix,params->nb_threads,(allocator_type *)&local_48);
  local_48 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->coboundary_matrix_offsets,params->nb_threads,&local_48,&local_49);
  this->modulus = params->modulus;
  local_48 = (value_type_conflict3)(_graph->super_directed_graph_t).number_of_vertices;
  iVar5._M_current =
       (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar4 = (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  if (iVar5._M_current == puVar4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (local_40,iVar5,&local_48);
    iVar5._M_current =
         (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    *iVar5._M_current = local_48;
    iVar5._M_current = iVar5._M_current + 1;
    (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current;
  }
  local_48 = (ulong)((long)(_graph->super_directed_graph_t).edges.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(_graph->super_directed_graph_t).edges.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 1) >> 1;
  if (iVar5._M_current == puVar4) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (local_40,iVar5,&local_48);
  }
  else {
    *iVar5._M_current = local_48;
    (this->cell_count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
  }
  if (1 < this->min_dimension) {
    if (this->filtration_algorithm == (filtration_algorithm_t *)0x0) {
      return;
    }
    iVar3 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
    if ((char)iVar3 == '\0') {
      return;
    }
  }
  prepare_graph_filtration<directed_flag_complex_t>
            (&this->flag_complex,this->graph,this->filtration_algorithm,this->nb_threads);
  return;
}

Assistant:

directed_flag_complex_computer_t(filtered_directed_graph_t& _graph, const flagser_parameters& params)
	    : graph(_graph), filtration_algorithm(params.filtration_algorithm.get()), max_dimension(params.max_dimension),
	      min_dimension(params.min_dimension), cache(params.cache), nb_threads(params.nb_threads), flag_complex(graph),
	      coboundary_matrix(params.nb_threads), coboundary_matrix_offsets(params.nb_threads, 0),
	      modulus(params.modulus) {
		cell_count.push_back(_graph.vertex_number());
		cell_count.push_back(_graph.edge_number());

		// Order the edges and compute the correct filtration
		if (min_dimension <= 1 || (filtration_algorithm != nullptr && filtration_algorithm->needs_face_filtration()))
			prepare_graph_filtration(flag_complex, graph, filtration_algorithm, nb_threads);
	}